

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O0

bool __thiscall Assimp::DefaultIOSystem::ComparePaths(DefaultIOSystem *this,char *one,char *second)

{
  int iVar1;
  undefined1 local_68 [8];
  string temp2;
  string temp1;
  char *second_local;
  char *one_local;
  DefaultIOSystem *this_local;
  
  iVar1 = ASSIMP_stricmp(one,second);
  if (iVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    MakeAbsolutePath_abi_cxx11_((string *)((long)&temp2.field_2 + 8),one);
    MakeAbsolutePath_abi_cxx11_((string *)local_68,second);
    iVar1 = ASSIMP_stricmp((string *)((long)&temp2.field_2 + 8),(string *)local_68);
    this_local._7_1_ = iVar1 == 0;
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(temp2.field_2._M_local_buf + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultIOSystem::ComparePaths(const char* one, const char* second) const
{
    // chances are quite good both paths are formatted identically,
    // so we can hopefully return here already
    if (!ASSIMP_stricmp(one, second))
        return true;

    std::string temp1 = MakeAbsolutePath(one);
    std::string temp2 = MakeAbsolutePath(second);

    return !ASSIMP_stricmp(temp1, temp2);
}